

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QLocale::toCurrencyString
          (QString *__return_storage_ptr__,QLocale *this,qulonglong value,QString *symbol)

{
  long lVar1;
  char16_t *pcVar2;
  QLocaleData *pQVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QSystemLocale *pQVar7;
  long in_FS_OFFSET;
  DataRange local_c0;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  CurrencyToStringArgument arg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    arg.symbol.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    arg.symbol.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    arg.symbol.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    arg.value.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    arg.value.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    arg.value.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    arg.value.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant((QVariant *)&local_98,value);
    QSystemLocale::CurrencyToStringArgument::CurrencyToStringArgument
              (&arg,(QVariant *)&local_98,symbol);
    ::QVariant::~QVariant((QVariant *)&local_98);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = systemLocale();
    ::QVariant::fromValue<QSystemLocale::CurrencyToStringArgument>
              ((enable_if_t<std::is_copy_constructible_v<QSystemLocale::CurrencyToStringArgument>_&&_std::is_destructible_v<QSystemLocale::CurrencyToStringArgument>,_QVariant>
                *)&local_b8,&arg);
    (*pQVar7->_vptr_QSystemLocale[2])(&local_98,pQVar7,0x20,&local_b8);
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_b8);
    if ((__return_storage_ptr__->d).size != 0) {
      QSystemLocale::CurrencyToStringArgument::~CurrencyToStringArgument(&arg);
      goto LAB_002e15fc;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
    QSystemLocale::CurrencyToStringArgument::~CurrencyToStringArgument(&arg);
  }
  arg.value.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  arg.value.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  arg.value.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  toString((QString *)&arg,this,value);
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pcVar2 = (symbol->d).ptr;
  if (pcVar2 == (char16_t *)0x0) {
    currencySymbol((QString *)&local_98,this,CurrencySymbol);
  }
  else {
    local_98.shared = (PrivateShared *)(symbol->d).d;
    local_98._16_8_ = (symbol->d).size;
    local_98._8_8_ = pcVar2;
    if (local_98.shared != (PrivateShared *)0x0) {
      LOCK();
      (((QArrayData *)&(local_98.shared)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&(local_98.shared)->ref)->ref_)._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
  }
  if ((undefined1 *)local_98._16_8_ == (undefined1 *)0x0) {
    currencySymbol((QString *)&local_b8,this,CurrencyIsoCode);
    uVar6 = local_98._16_8_;
    uVar5 = local_98._8_8_;
    uVar4 = local_98.shared;
    local_98.shared = local_b8.shared;
    local_98._8_8_ = local_b8._8_8_;
    local_b8.shared = (PrivateShared *)uVar4;
    local_b8._8_8_ = uVar5;
    local_98._16_8_ = local_b8._16_8_;
    local_b8._16_8_ = uVar6;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  }
  pQVar3 = ((this->d).d.ptr)->m_data;
  local_c0 = (DataRange)
             ((ulong)pQVar3->m_currencyFormat_size << 0x20 | (ulong)pQVar3->m_currencyFormat_idx);
  QLocaleData::DataRange::getData
            ((QString *)&local_b8,&local_c0,
             L"%1%2%1\xa0%2(%2%1)%2\xa0%1(%1\xa0%2)\x200f%1\xa0%2\x061c%1%2(\x061c%1%2)(%1%2)(%1)\xa0%2(%2\xa0%1)%2-%1%1\x202f%2\x200f%1\xa0\x200f%2\x200f\x200e-%1\xa0\x200f%2%2\xa0-%1%2−%1%2-\xa0%1\x200e%2\xa0%1\x200e(%2\xa0%1)"
            );
  QString::arg<QString&,QString&>
            (__return_storage_ptr__,(QString *)&local_b8,(QString *)&arg,(QString *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&arg);
LAB_002e15fc:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::toCurrencyString(qulonglong value, const QString &symbol) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QSystemLocale::CurrencyToStringArgument arg(value, symbol);
        auto res = systemLocale()->query(QSystemLocale::CurrencyToString,
                                         QVariant::fromValue(arg)).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    QString str = toString(value);
    QString sym = symbol.isNull() ? currencySymbol() : symbol;
    if (sym.isEmpty())
        sym = currencySymbol(CurrencyIsoCode);
    return d->m_data->currencyFormat().getData(currency_format_data).arg(str, sym);
}